

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage2d_neg_level
               (NegativeTestContext *ctx)

{
  deUint32 dVar1;
  int faceIterTcu;
  CubeFace CVar2;
  int faceIterTcu_1;
  allocator<char> local_49;
  GLuint textures [2];
  string local_40;
  
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,textures);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,textures[0]);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,textures[1]);
  for (CVar2 = CUBEFACE_NEGATIVE_X; CVar2 != CUBEFACE_LAST; CVar2 = CVar2 + CUBEFACE_POSITIVE_X) {
    dVar1 = cubeFaceToGLFace(CVar2);
    glu::CallLogWrapper::glTexImage2D
              (&ctx->super_CallLogWrapper,dVar1,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_INVALID_VALUE is generated if level is less than 0.",&local_49)
  ;
  NegativeTestContext::beginSection(ctx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  glu::CallLogWrapper::glCopyTexSubImage2D(&ctx->super_CallLogWrapper,0xde1,-1,0,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  for (CVar2 = CUBEFACE_NEGATIVE_X; CVar2 != CUBEFACE_LAST; CVar2 = CVar2 + CUBEFACE_POSITIVE_X) {
    dVar1 = cubeFaceToGLFace(CVar2);
    glu::CallLogWrapper::glCopyTexSubImage2D(&ctx->super_CallLogWrapper,dVar1,-1,0,0,0,0,4,4);
    NegativeTestContext::expectError(ctx,0x501);
  }
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,textures);
  return;
}

Assistant:

void copytexsubimage2d_neg_level (NegativeTestContext& ctx)
{
	GLuint textures[2];
	ctx.glGenTextures	(2, &textures[0]);
	ctx.glBindTexture	(GL_TEXTURE_2D, textures[0]);
	ctx.glTexImage2D	(GL_TEXTURE_2D, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture	(GL_TEXTURE_CUBE_MAP, textures[1]);
	FOR_CUBE_FACES(faceGL, ctx.glTexImage2D(faceGL, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0););

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, -1, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	FOR_CUBE_FACES(faceGL,
	{
		ctx.glCopyTexSubImage2D(faceGL, -1, 0, 0, 0, 0, 4, 4);
		ctx.expectError(GL_INVALID_VALUE);
	});
	ctx.endSection();

	ctx.glDeleteTextures(2, &textures[0]);
}